

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::writeDataToTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  TransferFormat TVar1;
  pointer pixels;
  int iVar2;
  GLenum err;
  ostream *poVar3;
  TestError *this_00;
  GLint depth;
  ulong local_70;
  TransferFormat local_68;
  Functions *local_60;
  size_t local_58;
  GLint height;
  GLint width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  
  local_60 = gl;
  poVar3 = std::operator<<((ostream *)&this->field_0x88,"Fill texture [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  if (level <= (this->mState).levels + -1) {
    local_68 = glu::getTransferFormat((this->mState).format);
    SparseTextureUtils::getTextureLevelSize(target,&this->mState,level,&width,&height,&depth);
    if ((0 < height && 0 < width) &&
       (local_70 = (ulong)(uint)depth, (this->mState).minDepth <= depth)) {
      iVar2 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58 = (size_t)(iVar2 * (int)local_70 * height * width);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecData,local_58);
      pixels = vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar1 = local_68;
      memset(vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,(uint)(byte)((char)level * '\x10' + 0x10),local_58);
      gl4cts::Texture::SubImage
                (local_60,target,level,0,0,0,width,height,(GLsizei)local_70,local_68.format,
                 TVar1.dataType,pixels);
      err = (*local_60->getError)();
      glu::checkError(err,"SubImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x7ac);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return true;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
             ,0x797);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTextureCommitmentTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
														 GLuint& texture, GLint level)
{
	DE_UNREF(format);
	DE_UNREF(texture);

	mLog << "Fill texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 16 + 16 * level, texSize);

		Texture::SubImage(gl, target, level, 0, 0, 0, width, height, depth, transferFormat.format,
						  transferFormat.dataType, (GLvoid*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "SubImage");
	}

	return true;
}